

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O3

int mbedtls_pk_write_key_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  mbedtls_rsa_context *ctx;
  mbedtls_ecp_keypair *ec;
  mbedtls_pk_type_t mVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar9;
  size_t sVar10;
  uchar *c;
  mbedtls_mpi T;
  uchar *local_60;
  mbedtls_mpi local_58;
  uint local_3c;
  undefined8 local_38;
  
  local_60 = buf + size;
  mVar1 = mbedtls_pk_get_type(key);
  if (mVar1 != MBEDTLS_PK_RSA) {
    mVar1 = mbedtls_pk_get_type(key);
    if (mVar1 != MBEDTLS_PK_ECKEY) {
      return -0x3980;
    }
    ec = (mbedtls_ecp_keypair *)key->pk_ctx;
    iVar2 = pk_write_ec_pubkey(&local_60,buf,ec);
    if (iVar2 < 0) {
      return iVar2;
    }
    if (local_60 == buf || (long)local_60 - (long)buf < 0) {
      return -0x6c;
    }
    local_60[-1] = '\0';
    local_60 = local_60 + -1;
    uVar5 = mbedtls_asn1_write_len(&local_60,buf,(ulong)(iVar2 + 1));
    if ((int)uVar5 < 0) {
      return uVar5;
    }
    uVar3 = mbedtls_asn1_write_tag(&local_60,buf,'\x03');
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    sVar10 = (ulong)(iVar2 + 1) + (ulong)uVar3 + (ulong)uVar5;
    uVar5 = mbedtls_asn1_write_len(&local_60,buf,sVar10);
    if ((int)uVar5 < 0) {
      return uVar5;
    }
    uVar3 = mbedtls_asn1_write_tag(&local_60,buf,0xa1);
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    uVar4 = pk_write_ec_param(&local_60,buf,(mbedtls_ecp_keypair *)(ulong)(ec->grp).id);
    if ((int)uVar4 < 0) {
      return uVar4;
    }
    iVar2 = mbedtls_asn1_write_len(&local_60,buf,(ulong)uVar4);
    local_38 = CONCAT44(extraout_var,iVar2);
    if (iVar2 < 0) {
      return iVar2;
    }
    local_3c = mbedtls_asn1_write_tag(&local_60,buf,0xa0);
    if ((int)local_3c < 0) {
      return local_3c;
    }
    uVar6 = mbedtls_asn1_write_mpi(&local_60,buf,&ec->d);
    if ((int)uVar6 < 0) {
      return uVar6;
    }
    *local_60 = '\x04';
    uVar7 = mbedtls_asn1_write_int(&local_60,buf,1);
    if ((int)uVar7 < 0) {
      return uVar7;
    }
    sVar10 = sVar10 + uVar5 + (ulong)uVar3 + (ulong)((int)local_38 + uVar4) +
             (ulong)uVar7 + (ulong)uVar6 + (ulong)local_3c;
    iVar2 = mbedtls_asn1_write_len(&local_60,buf,sVar10);
    if (iVar2 < 0) {
      return iVar2;
    }
    iVar8 = mbedtls_asn1_write_tag(&local_60,buf,'0');
    if (iVar8 < 0) {
      return iVar8;
    }
    return (int)sVar10 + iVar8 + iVar2;
  }
  ctx = (mbedtls_rsa_context *)key->pk_ctx;
  mbedtls_mpi_init(&local_58);
  uVar9 = 0;
  iVar2 = mbedtls_rsa_export_crt(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_58);
  if (iVar2 == 0) {
    uVar3 = mbedtls_asn1_write_mpi(&local_60,buf,&local_58);
    uVar9 = (ulong)uVar3;
    uVar5 = uVar3;
    if ((int)uVar3 < 0) {
LAB_0011d58e:
      mbedtls_mpi_free(&local_58);
      return uVar5;
    }
    iVar2 = mbedtls_rsa_export_crt(ctx,(mbedtls_mpi *)0x0,&local_58,(mbedtls_mpi *)0x0);
    if (iVar2 == 0) {
      uVar5 = mbedtls_asn1_write_mpi(&local_60,buf,&local_58);
      if ((int)uVar5 < 0) goto LAB_0011d58e;
      uVar9 = (ulong)(uVar5 + uVar3);
      iVar2 = mbedtls_rsa_export_crt(ctx,&local_58,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
      if (iVar2 == 0) {
        uVar5 = mbedtls_asn1_write_mpi(&local_60,buf,&local_58);
        if ((int)uVar5 < 0) goto LAB_0011d58e;
        uVar9 = uVar5 + uVar9;
        iVar2 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_58,
                                   (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
        if (iVar2 == 0) {
          uVar5 = mbedtls_asn1_write_mpi(&local_60,buf,&local_58);
          if ((int)uVar5 < 0) goto LAB_0011d58e;
          uVar9 = uVar9 + uVar5;
          iVar2 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,&local_58,(mbedtls_mpi *)0x0,
                                     (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
          if (iVar2 == 0) {
            uVar5 = mbedtls_asn1_write_mpi(&local_60,buf,&local_58);
            if ((int)uVar5 < 0) goto LAB_0011d58e;
            uVar9 = uVar9 + uVar5;
            iVar2 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                       &local_58,(mbedtls_mpi *)0x0);
            if (iVar2 == 0) {
              uVar5 = mbedtls_asn1_write_mpi(&local_60,buf,&local_58);
              if ((int)uVar5 < 0) goto LAB_0011d58e;
              uVar9 = uVar9 + uVar5;
              iVar2 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                         (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,&local_58);
              if (iVar2 == 0) {
                uVar5 = mbedtls_asn1_write_mpi(&local_60,buf,&local_58);
                if ((int)uVar5 < 0) goto LAB_0011d58e;
                uVar9 = uVar9 + uVar5;
                iVar2 = mbedtls_rsa_export(ctx,&local_58,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                           (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
                if (iVar2 == 0) {
                  uVar5 = mbedtls_asn1_write_mpi(&local_60,buf,&local_58);
                  if ((int)uVar5 < 0) goto LAB_0011d58e;
                  uVar9 = uVar9 + uVar5;
                  mbedtls_mpi_free(&local_58);
                  goto LAB_0011d28c;
                }
              }
            }
          }
        }
      }
    }
  }
  mbedtls_mpi_free(&local_58);
  if (iVar2 < 0) {
    return iVar2;
  }
LAB_0011d28c:
  uVar3 = mbedtls_asn1_write_int(&local_60,buf,0);
  uVar5 = uVar3;
  if (-1 < (int)uVar3) {
    uVar4 = mbedtls_asn1_write_len(&local_60,buf,uVar9 + uVar3);
    uVar5 = uVar4;
    if ((-1 < (int)uVar4) && (uVar5 = mbedtls_asn1_write_tag(&local_60,buf,'0'), -1 < (int)uVar5)) {
      uVar5 = (int)(uVar9 + uVar3) + uVar5 + uVar4;
    }
  }
  return uVar5;
}

Assistant:

int mbedtls_pk_write_key_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret;
    unsigned char *c = buf + size;
    size_t len = 0;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_mpi T; /* Temporary holding the exported parameters */
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( *key );

        /*
         * Export the parameters one after another to avoid simultaneous copies.
         */

        mbedtls_mpi_init( &T );

        /* Export QP */
        if( ( ret = mbedtls_rsa_export_crt( rsa, NULL, NULL, &T ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export DQ */
        if( ( ret = mbedtls_rsa_export_crt( rsa, NULL, &T, NULL ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export DP */
        if( ( ret = mbedtls_rsa_export_crt( rsa, &T, NULL, NULL ) ) != 0 ||
            ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export Q */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         &T, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export P */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, &T,
                                         NULL, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export D */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         NULL, &T, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export E */
        if ( ( ret = mbedtls_rsa_export( rsa, NULL, NULL,
                                         NULL, NULL, &T ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

        /* Export N */
        if ( ( ret = mbedtls_rsa_export( rsa, &T, NULL,
                                         NULL, NULL, NULL ) ) != 0 ||
             ( ret = mbedtls_asn1_write_mpi( &c, buf, &T ) ) < 0 )
            goto end_of_export;
        len += ret;

    end_of_export:

        mbedtls_mpi_free( &T );
        if( ret < 0 )
            return( ret );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 0 ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c,
                                               buf, MBEDTLS_ASN1_CONSTRUCTED |
                                               MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ec = mbedtls_pk_ec( *key );
        size_t pub_len = 0, par_len = 0;

        /*
         * RFC 5915, or SEC1 Appendix C.4
         *
         * ECPrivateKey ::= SEQUENCE {
         *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
         *      privateKey     OCTET STRING,
         *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
         *      publicKey  [1] BIT STRING OPTIONAL
         *    }
         */

        /* publicKey */
        MBEDTLS_ASN1_CHK_ADD( pub_len, pk_write_ec_pubkey( &c, buf, ec ) );

        if( c - buf < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        *--c = 0;
        pub_len += 1;

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) );
        len += pub_len;

        /* parameters */
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, ec ) );

        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_len( &c, buf, par_len ) );
        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) );
        len += par_len;

        /* privateKey: write as MPI then fix tag */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &ec->d ) );
        *c = MBEDTLS_ASN1_OCTET_STRING;

        /* version */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 1 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_ECP_C */
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}